

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_tri_uv_bounding_box(REF_GRID ref_grid,REF_INT node,REF_DBL *uv_min,REF_DBL *uv_max)

{
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  REF_INT cell;
  char *pcVar6;
  long lVar7;
  undefined1 auVar8 [16];
  REF_INT id;
  REF_INT sense;
  REF_DBL uv [2];
  REF_INT nodes [27];
  REF_INT local_c0;
  REF_INT local_bc;
  undefined1 local_b8 [16];
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  uVar3 = ref_geom_unique_id(ref_geom,node,2,&local_c0);
  if (uVar3 == 0) {
    uVar3 = ref_geom_tuv(ref_geom,node,2,local_c0,uv_min);
    if (uVar3 == 0) {
      uVar3 = ref_geom_tuv(ref_geom,node,2,local_c0,uv_max);
      if (uVar3 == 0) {
        if (node < 0) {
          return 0;
        }
        pRVar1 = ref_cell->ref_adj;
        if (pRVar1->nnode <= node) {
          return 0;
        }
        lVar7 = (long)pRVar1->first[(uint)node];
        if (lVar7 == -1) {
          return 0;
        }
        cell = pRVar1->item[lVar7].ref;
        while (uVar3 = ref_cell_nodes(ref_cell,cell,local_a8), uVar3 == 0) {
          if (0 < ref_cell->node_per) {
            lVar5 = 0;
            do {
              uVar3 = ref_geom_cell_tuv(ref_geom,local_a8[lVar5],local_a8,2,(REF_DBL *)local_b8,
                                        &local_bc);
              if (uVar3 != 0) {
                pcVar6 = "cell uv";
                uVar4 = 0x5d1;
                goto LAB_00149f1a;
              }
              auVar8 = minpd(*(undefined1 (*) [16])uv_min,local_b8);
              *(undefined1 (*) [16])uv_min = auVar8;
              auVar8 = maxpd(*(undefined1 (*) [16])uv_max,local_b8);
              *(undefined1 (*) [16])uv_max = auVar8;
              lVar5 = lVar5 + 1;
            } while (lVar5 < ref_cell->node_per);
          }
          pRVar2 = ref_cell->ref_adj->item;
          lVar7 = (long)pRVar2[(int)lVar7].next;
          if (lVar7 == -1) {
            return 0;
          }
          cell = pRVar2[lVar7].ref;
        }
        pcVar6 = "cell nodes";
        uVar4 = 0x5cd;
      }
      else {
        pcVar6 = "uv_max";
        uVar4 = 0x5ca;
      }
    }
    else {
      pcVar6 = "uv_min";
      uVar4 = 0x5c9;
    }
  }
  else {
    pcVar6 = "id";
    uVar4 = 0x5c8;
  }
LAB_00149f1a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
         "ref_geom_tri_uv_bounding_box",(ulong)uVar3,pcVar6);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_box(REF_GRID ref_grid, REF_INT node,
                                                REF_DBL *uv_min,
                                                REF_DBL *uv_max) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node, id, iuv;
  REF_DBL uv[2];
  REF_INT sense;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  /* get face id and initialize min and max */
  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "id");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_min), "uv_min");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_max), "uv_max");

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                            uv, &sense),
          "cell uv");
      for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = MIN(uv_min[iuv], uv[iuv]);
      for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = MAX(uv_max[iuv], uv[iuv]);
    }
  }

  return REF_SUCCESS;
}